

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int editPage(MemPage *pPg,int iOld,int iNew,int nNew,CellArray *pCArray)

{
  u8 *puVar1;
  byte bVar2;
  u16 uVar3;
  ushort uVar4;
  int iVar5;
  u8 *pBegin;
  undefined4 extraout_var;
  uint uVar6;
  u16 *puVar7;
  undefined4 in_register_00000014;
  int iVar8;
  int iVar9;
  ulong uVar10;
  undefined8 uVar11;
  long lVar12;
  uint uVar13;
  u8 *pData;
  u8 *local_58;
  ulong local_50;
  u8 *local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_00000014,iNew);
  puVar1 = pPg->aData;
  pBegin = pPg->aCellIdx + nNew * 2;
  uVar10 = (ulong)pPg->hdrOffset;
  uVar4 = pPg->nCell;
  uVar13 = (uint)uVar4;
  iVar8 = (uint)pPg->nOverflow + (uint)uVar4 + iOld;
  local_38 = (ulong)(uint)(iOld - iNew);
  iVar5 = nNew + iNew;
  if (iOld < iNew) {
    local_48 = (u8 *)CONCAT44(local_48._4_4_,nNew + iNew);
    iVar5 = pageFreeArray(pPg,iOld,iNew - iOld,pCArray);
    local_50 = CONCAT44(extraout_var,iVar5);
    memmove(pPg->aCellIdx,pPg->aCellIdx + iVar5 * 2,(ulong)((uint)uVar4 * 2));
    uVar13 = (uint)uVar4 - (int)local_50;
    iVar5 = (int)local_48;
  }
  iVar9 = iVar8 - iVar5;
  if (iVar9 != 0 && iVar5 <= iVar8) {
    iVar5 = pageFreeArray(pPg,iVar5,iVar9,pCArray);
    uVar13 = uVar13 - iVar5;
  }
  uVar11 = local_40;
  local_58 = puVar1 + (ulong)((ushort)(*(ushort *)(puVar1 + uVar10 + 5) << 8 |
                                      *(ushort *)(puVar1 + uVar10 + 5) >> 8) - 1 & 0xffff) + 1;
  iVar5 = (int)local_40;
  local_50 = uVar10;
  local_48 = puVar1;
  if (pBegin <= local_58) {
    if (iVar5 < iOld) {
      iVar8 = (int)local_38;
      if (nNew <= (int)local_38) {
        iVar8 = nNew;
      }
      puVar1 = pPg->aCellIdx;
      memmove(puVar1 + iVar8 * 2,puVar1,(long)(int)(uVar13 * 2));
      iVar9 = pageInsertArray(pPg,pBegin,&local_58,puVar1,iVar5,iVar8,pCArray);
      if (iVar9 != 0) goto LAB_0013c14e;
      uVar13 = uVar13 + iVar8;
    }
    bVar2 = pPg->nOverflow;
    if (bVar2 != 0) {
      uVar10 = 0;
      do {
        iVar8 = (uint)pPg->aiOvfl[uVar10] + iOld;
        uVar6 = iVar8 - (int)uVar11;
        if ((int)uVar6 < nNew && -1 < (int)uVar6) {
          puVar1 = pPg->aCellIdx + (ulong)uVar6 * 2;
          memmove(pPg->aCellIdx + (ulong)uVar6 * 2 + 2,puVar1,(long)(int)((uVar13 - uVar6) * 2));
          uVar11 = local_40;
          iVar5 = (int)local_40;
          iVar8 = pageInsertArray(pPg,pBegin,&local_58,puVar1,iVar8,1,pCArray);
          if (iVar8 != 0) goto LAB_0013c14e;
          uVar13 = uVar13 + 1;
          bVar2 = pPg->nOverflow;
        }
        iVar5 = (int)uVar11;
        uVar10 = uVar10 + 1;
      } while (uVar10 < bVar2);
    }
    iVar8 = pageInsertArray(pPg,pBegin,&local_58,pPg->aCellIdx + (int)(uVar13 * 2),uVar13 + iVar5,
                            nNew - uVar13,pCArray);
    if (iVar8 == 0) {
      pPg->nCell = (u16)nNew;
      pPg->nOverflow = '\0';
      local_48[local_50 + 3] = (u8)((uint)nNew >> 8);
      local_48[local_50 + 4] = (u8)pPg->nCell;
      uVar4 = (ushort)((int)local_58 - (int)local_48);
      *(ushort *)(local_48 + local_50 + 5) = uVar4 << 8 | uVar4 >> 8;
      return 0;
    }
  }
LAB_0013c14e:
  if (nNew < 1) {
    puVar7 = pCArray->szCell;
  }
  else {
    puVar7 = pCArray->szCell;
    lVar12 = (long)iVar5 * 2;
    iVar8 = nNew + 1;
    do {
      if (*(short *)((long)puVar7 + lVar12) == 0) {
        uVar3 = (*pCArray->pRef->xCellSize)
                          (pCArray->pRef,*(u8 **)((long)pCArray->apCell + lVar12 * 4));
        puVar7 = pCArray->szCell;
        *(u16 *)((long)puVar7 + lVar12) = uVar3;
      }
      lVar12 = lVar12 + 2;
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  iVar5 = rebuildPage(pPg,nNew,pCArray->apCell + iVar5,puVar7 + iVar5);
  return iVar5;
}

Assistant:

static int editPage(
  MemPage *pPg,                   /* Edit this page */
  int iOld,                       /* Index of first cell currently on page */
  int iNew,                       /* Index of new first cell on page */
  int nNew,                       /* Final number of cells on page */
  CellArray *pCArray              /* Array of cells and sizes */
){
  u8 * const aData = pPg->aData;
  const int hdr = pPg->hdrOffset;
  u8 *pBegin = &pPg->aCellIdx[nNew * 2];
  int nCell = pPg->nCell;       /* Cells stored on pPg */
  u8 *pData;
  u8 *pCellptr;
  int i;
  int iOldEnd = iOld + pPg->nCell + pPg->nOverflow;
  int iNewEnd = iNew + nNew;

#ifdef SQLITE_DEBUG
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  memcpy(pTmp, aData, pPg->pBt->usableSize);
#endif

  /* Remove cells from the start and end of the page */
  if( iOld<iNew ){
    int nShift = pageFreeArray(pPg, iOld, iNew-iOld, pCArray);
    memmove(pPg->aCellIdx, &pPg->aCellIdx[nShift*2], nCell*2);
    nCell -= nShift;
  }
  if( iNewEnd < iOldEnd ){
    nCell -= pageFreeArray(pPg, iNewEnd, iOldEnd - iNewEnd, pCArray);
  }

  pData = &aData[get2byteNotZero(&aData[hdr+5])];
  if( pData<pBegin ) goto editpage_fail;

  /* Add cells to the start of the page */
  if( iNew<iOld ){
    int nAdd = MIN(nNew,iOld-iNew);
    assert( (iOld-iNew)<nNew || nCell==0 || CORRUPT_DB );
    pCellptr = pPg->aCellIdx;
    memmove(&pCellptr[nAdd*2], pCellptr, nCell*2);
    if( pageInsertArray(
          pPg, pBegin, &pData, pCellptr,
          iNew, nAdd, pCArray
    ) ) goto editpage_fail;
    nCell += nAdd;
  }

  /* Add any overflow cells */
  for(i=0; i<pPg->nOverflow; i++){
    int iCell = (iOld + pPg->aiOvfl[i]) - iNew;
    if( iCell>=0 && iCell<nNew ){
      pCellptr = &pPg->aCellIdx[iCell * 2];
      memmove(&pCellptr[2], pCellptr, (nCell - iCell) * 2);
      nCell++;
      if( pageInsertArray(
            pPg, pBegin, &pData, pCellptr,
            iCell+iNew, 1, pCArray
      ) ) goto editpage_fail;
    }
  }

  /* Append cells to the end of the page */
  pCellptr = &pPg->aCellIdx[nCell*2];
  if( pageInsertArray(
        pPg, pBegin, &pData, pCellptr,
        iNew+nCell, nNew-nCell, pCArray
  ) ) goto editpage_fail;

  pPg->nCell = nNew;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);

#ifdef SQLITE_DEBUG
  for(i=0; i<nNew && !CORRUPT_DB; i++){
    u8 *pCell = pCArray->apCell[i+iNew];
    int iOff = get2byteAligned(&pPg->aCellIdx[i*2]);
    if( SQLITE_WITHIN(pCell, aData, &aData[pPg->pBt->usableSize]) ){
      pCell = &pTmp[pCell - aData];
    }
    assert( 0==memcmp(pCell, &aData[iOff],
            pCArray->pRef->xCellSize(pCArray->pRef, pCArray->apCell[i+iNew])) );
  }
#endif

  return SQLITE_OK;
 editpage_fail:
  /* Unable to edit this page. Rebuild it from scratch instead. */
  populateCellCache(pCArray, iNew, nNew);
  return rebuildPage(pPg, nNew, &pCArray->apCell[iNew], &pCArray->szCell[iNew]);
}